

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcGetSceneLinearBounds(RTCScene hscene,RTCLinearBounds *bounds_o)

{
  undefined8 *puVar1;
  allocator local_51;
  DeviceEnterLeave enterleave;
  string local_48 [32];
  
  if (hscene == (RTCScene)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_48,"invalid argument",(allocator *)&enterleave);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar1 + 2),local_48);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hscene);
  if (bounds_o != (RTCLinearBounds *)0x0) {
    if (hscene[0x250] != (RTCSceneTy)0x1) {
      (bounds_o->bounds0).lower_x = *(float *)(hscene + 0x10);
      (bounds_o->bounds0).lower_y = *(float *)(hscene + 0x14);
      (bounds_o->bounds0).lower_z = *(float *)(hscene + 0x18);
      (bounds_o->bounds0).align0 = 0.0;
      (bounds_o->bounds0).upper_x = *(float *)(hscene + 0x20);
      (bounds_o->bounds0).upper_y = *(float *)(hscene + 0x24);
      (bounds_o->bounds0).upper_z = *(float *)(hscene + 0x28);
      (bounds_o->bounds0).align1 = 0.0;
      (bounds_o->bounds1).lower_x = *(float *)(hscene + 0x30);
      (bounds_o->bounds1).lower_y = *(float *)(hscene + 0x34);
      (bounds_o->bounds1).lower_z = *(float *)(hscene + 0x38);
      (bounds_o->bounds1).align0 = 0.0;
      (bounds_o->bounds1).upper_x = *(float *)(hscene + 0x40);
      (bounds_o->bounds1).upper_y = *(float *)(hscene + 0x44);
      (bounds_o->bounds1).upper_z = *(float *)(hscene + 0x48);
      (bounds_o->bounds1).align1 = 0.0;
      embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
      return;
    }
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_48,"scene not committed",&local_51);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 3;
    std::__cxx11::string::string((string *)(puVar1 + 2),local_48);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_48,"invalid destination pointer",&local_51);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_48);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcGetSceneLinearBounds(RTCScene hscene, RTCLinearBounds* bounds_o)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcGetSceneBounds);
    RTC_VERIFY_HANDLE(hscene);
    RTC_ENTER_DEVICE(hscene);
    if (bounds_o == nullptr)
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid destination pointer");
    if (scene->isModified())
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"scene not committed");
    
    bounds_o->bounds0.lower_x = scene->bounds.bounds0.lower.x;
    bounds_o->bounds0.lower_y = scene->bounds.bounds0.lower.y;
    bounds_o->bounds0.lower_z = scene->bounds.bounds0.lower.z;
    bounds_o->bounds0.align0  = 0;
    bounds_o->bounds0.upper_x = scene->bounds.bounds0.upper.x;
    bounds_o->bounds0.upper_y = scene->bounds.bounds0.upper.y;
    bounds_o->bounds0.upper_z = scene->bounds.bounds0.upper.z;
    bounds_o->bounds0.align1  = 0;
    bounds_o->bounds1.lower_x = scene->bounds.bounds1.lower.x;
    bounds_o->bounds1.lower_y = scene->bounds.bounds1.lower.y;
    bounds_o->bounds1.lower_z = scene->bounds.bounds1.lower.z;
    bounds_o->bounds1.align0  = 0;
    bounds_o->bounds1.upper_x = scene->bounds.bounds1.upper.x;
    bounds_o->bounds1.upper_y = scene->bounds.bounds1.upper.y;
    bounds_o->bounds1.upper_z = scene->bounds.bounds1.upper.z;
    bounds_o->bounds1.align1  = 0;
    RTC_CATCH_END2(scene);
  }